

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool QSslSocket::isClassImplemented(ImplementedClass cl,QString *backendName)

{
  long lVar1;
  ImplementedClass *pIVar2;
  QList<QSsl::ImplementedClass> *pQVar3;
  QList<QSsl::ImplementedClass> *__return_storage_ptr__;
  long in_FS_OFFSET;
  QList<QSsl::ImplementedClass> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__ = &local_30;
  implementedClasses(__return_storage_ptr__,backendName);
  if (local_30.d.size != 0) {
    pQVar3 = (QList<QSsl::ImplementedClass> *)0xfffffffffffffffc;
    do {
      lVar1 = local_30.d.size * -4 + (long)pQVar3;
      if (lVar1 == -4) goto LAB_00252df9;
      __return_storage_ptr__ = (QList<QSsl::ImplementedClass> *)((long)&(pQVar3->d).d + 4);
      pIVar2 = (ImplementedClass *)((long)(local_30.d.ptr + 1) + (long)pQVar3);
      pQVar3 = __return_storage_ptr__;
    } while (*pIVar2 != cl);
    __return_storage_ptr__ = (QList<QSsl::ImplementedClass> *)((long)__return_storage_ptr__ >> 2);
LAB_00252df9:
    if (lVar1 != -4) goto LAB_00252e06;
  }
  __return_storage_ptr__ = (QList<QSsl::ImplementedClass> *)0xffffffffffffffff;
LAB_00252e06:
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__ != (QList<QSsl::ImplementedClass> *)0xffffffffffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::isClassImplemented(QSsl::ImplementedClass cl, const QString &backendName)
{
    return implementedClasses(backendName).contains(cl);
}